

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O2

string * __thiscall Token::toString_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  TokenType type;
  
  type = this->type;
  if (((ulong)type < 0x29) && ((0x100041c0000U >> ((ulong)type & 0x3f) & 1) != 0)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->literal);
  }
  else {
    tokTypeToString_abi_cxx11_(__return_storage_ptr__,type);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString() {
        if (type == TokenType::String ||
            type == TokenType::Integer ||
            type == TokenType::Float ||
            type == TokenType::Identifier ||
            type == TokenType::Error) {
            return literal;
        } else return tokTypeToString(type);
    }